

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-database.c
# Opt level: O1

void CGTFS_Database(void)

{
  int iVar1;
  feed_db_status_t fVar2;
  feed_db_t db;
  feed_db_t db_2;
  feed_t fStack_148;
  feed_db_t local_58;
  
  iVar1 = greatest_test_pre("db_init_close_writable");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      fVar2 = init_feed_db((feed_db_t *)&fStack_148,"tests_db_init_0.db",1);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (fVar2 == FEED_DB_SUCCESS) {
        fVar2 = setup_feed_db((feed_db_t *)&fStack_148);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (fVar2 == FEED_DB_SUCCESS) {
          fVar2 = free_feed_db((feed_db_t *)&fStack_148);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (fVar2 == FEED_DB_SUCCESS) {
            greatest_info.msg = (char *)0x0;
            iVar1 = 0;
            goto LAB_00112859;
          }
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",1);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)fVar2);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x12;
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",1);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)fVar2);
          fputc(10,_stdout);
          greatest_info.fail_line = 0xf;
        }
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",1);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)fVar2);
        fputc(10,_stdout);
        greatest_info.fail_line = 0xc;
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database.c"
      ;
      greatest_info.msg = (fStack_148.calendar_dates)->service_id;
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_001146e5;
    }
LAB_00112859:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_init_close_readable_error");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      fVar2 = init_feed_db((feed_db_t *)&fStack_148,"tests_db_init_1.db",0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (fVar2 == FEED_DB_ERROR) {
        fVar2 = free_feed_db((feed_db_t *)&fStack_148);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (fVar2 == FEED_DB_SUCCESS) {
          greatest_info.msg = (char *)0x0;
          iVar1 = 0;
          goto LAB_00112a1d;
        }
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",1);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)fVar2);
        fputc(10,_stdout);
        greatest_info.fail_line = 0x1f;
        greatest_info.msg = "FEED_DB_SUCCESS != res";
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)fVar2);
        fputc(10,_stdout);
        greatest_info.fail_line = 0x1c;
        greatest_info.msg = "FEED_DB_ERROR != res";
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database.c"
      ;
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_001146e5;
    }
LAB_00112a1d:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_init_close_readable_success");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      greatest_info.assertions = greatest_info.assertions + 1;
      fVar2 = init_feed_db((feed_db_t *)&fStack_148,"tests_db_init_2.db",1);
      if (fVar2 == FEED_DB_SUCCESS) {
        greatest_info.assertions = greatest_info.assertions + 1;
        fVar2 = setup_feed_db((feed_db_t *)&fStack_148);
        if (fVar2 == FEED_DB_SUCCESS) {
          greatest_info.assertions = greatest_info.assertions + 1;
          fVar2 = free_feed_db((feed_db_t *)&fStack_148);
          if (fVar2 == FEED_DB_SUCCESS) {
            fVar2 = init_feed_db(&local_58,"tests_db_init_2.db",0);
            greatest_info.assertions = greatest_info.assertions + 1;
            if (fVar2 == FEED_DB_SUCCESS) {
              fVar2 = free_feed_db(&local_58);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (fVar2 == FEED_DB_SUCCESS) {
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_00112ca9;
              }
              fwrite("\nExpected: ",0xb,1,_stdout);
              fprintf(_stdout,"%i",1);
              fwrite("\n     Got: ",0xb,1,_stdout);
              fprintf(_stdout,"%i",(ulong)fVar2);
              fputc(10,_stdout);
              greatest_info.fail_line = 0x34;
            }
            else {
              fwrite("\nExpected: ",0xb,1,_stdout);
              fprintf(_stdout,"%i",1);
              fwrite("\n     Got: ",0xb,1,_stdout);
              fprintf(_stdout,"%i",(ulong)fVar2);
              fputc(10,_stdout);
              greatest_info.fail_line = 0x31;
            }
            greatest_info.msg = "FEED_DB_SUCCESS != res";
          }
          else {
            greatest_info.fail_line = 0x2a;
            greatest_info.msg = "FEED_DB_SUCCESS != free_feed_db(&_db)";
          }
        }
        else {
          greatest_info.fail_line = 0x29;
          greatest_info.msg = "FEED_DB_SUCCESS != setup_feed_db(&_db)";
        }
      }
      else {
        greatest_info.fail_line = 0x28;
        greatest_info.msg = "FEED_DB_SUCCESS != init_feed_db(&_db, \"tests_db_init_2.db\", 1)";
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database.c"
      ;
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_001146e5;
    }
LAB_00112ca9:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_import");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      init_feed_db((feed_db_t *)&fStack_148,"tests_feed_import.db",1);
      fVar2 = import_feed_db("../tests/data/stupid_gtfs",(feed_db_t *)&fStack_148);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (fVar2 == FEED_DB_SUCCESS) {
        free_feed_db((feed_db_t *)&fStack_148);
        greatest_info.msg = (char *)0x0;
        iVar1 = 0;
      }
      else {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database.c"
        ;
        greatest_info.fail_line = 0x40;
        greatest_info.msg = (fStack_148.calendar_dates)->service_id;
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_001146e5;
      }
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_store_no_counter");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      fVar2 = init_feed_db((feed_db_t *)&fStack_148,"tests_feed_1_no_counter.db",1);
      if (fVar2 == FEED_DB_SUCCESS) {
        fVar2 = setup_feed_db((feed_db_t *)&fStack_148);
        if (fVar2 == FEED_DB_SUCCESS) {
          iVar1 = 0;
          fVar2 = store_feed_db("../tests/data/stupid_gtfs",(feed_db_t *)&fStack_148,(feed_t *)0x0);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (fVar2 == FEED_DB_SUCCESS) {
            free_feed_db((feed_db_t *)&fStack_148);
            greatest_info.msg = (char *)0x0;
            goto LAB_00112e5c;
          }
          greatest_info.fail_line = 0x55;
          greatest_info.msg = "FEED_DB_SUCCESS != res";
        }
        else {
          greatest_info.fail_line = 0x51;
          greatest_info.msg =
               "Failed to create a table layout at `tests_feed_1_no_counter.db` (writable)";
        }
      }
      else {
        greatest_info.fail_line = 0x4d;
        greatest_info.msg =
             "Failed to initialize a database `tests_feed_1_no_counter.db` (writable)";
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database.c"
      ;
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_001146e5;
    }
LAB_00112e5c:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_store_partial");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      fVar2 = init_feed_db((feed_db_t *)&fStack_148,"tests_feed_3_partial.db",1);
      if (fVar2 == FEED_DB_SUCCESS) {
        fVar2 = setup_feed_db((feed_db_t *)&fStack_148);
        if (fVar2 == FEED_DB_SUCCESS) {
          iVar1 = 0;
          fVar2 = store_feed_db("../tests/data/google_sample",(feed_db_t *)&fStack_148,(feed_t *)0x0
                               );
          greatest_info.assertions = greatest_info.assertions + 1;
          if (fVar2 == FEED_DB_PARTIAL) {
            free_feed_db((feed_db_t *)&fStack_148);
            greatest_info.msg = (char *)0x0;
            goto LAB_00112f60;
          }
          greatest_info.fail_line = 0x6a;
          greatest_info.msg = "FEED_DB_PARTIAL != res";
        }
        else {
          greatest_info.fail_line = 0x66;
          greatest_info.msg =
               "Failed to create a table layout at `tests_feed_3_partial.db` (writable)";
        }
      }
      else {
        greatest_info.fail_line = 0x62;
        greatest_info.msg = "Failed to initialize a database `tests_feed_3_partial.db` (writable)";
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database.c"
      ;
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_001146e5;
    }
LAB_00112f60:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_store_counter");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      fVar2 = init_feed_db(&local_58,"tests_feed_2_counter.db",1);
      if (fVar2 == FEED_DB_SUCCESS) {
        fVar2 = setup_feed_db(&local_58);
        if (fVar2 == FEED_DB_SUCCESS) {
          fVar2 = store_feed_db("../tests/data/stupid_gtfs",&local_58,&fStack_148);
          if (fVar2 == FEED_DB_SUCCESS) {
            if (fStack_148.agency_count == 4) {
              if (fStack_148.calendar_records_count == 4) {
                if (fStack_148.calendar_dates_count == 9) {
                  if (fStack_148.fare_attributes_count == 2) {
                    if (fStack_148.fare_rules_count == 4) {
                      if (fStack_148.feed_info_count == 1) {
                        if (fStack_148.frequencies_count == 0xb) {
                          if (fStack_148.levels_count == 4) {
                            if (fStack_148.pathways_count == 2) {
                              if (fStack_148.routes_count == 8) {
                                if (fStack_148.shapes_count == 10) {
                                  if (fStack_148.stop_times_count == 0x1c) {
                                    if (fStack_148.stops_count == 6) {
                                      if (fStack_148.transfers_count == 4) {
                                        greatest_info.assertions = greatest_info.assertions + 0x10;
                                        if (fStack_148.trips_count == 4) {
                                          free_feed_db(&local_58);
                                          greatest_info.msg = (char *)0x0;
                                          iVar1 = 0;
                                          goto LAB_00113b4e;
                                        }
                                        fwrite("\nExpected: ",0xb,1,_stdout);
                                        fprintf(_stdout,"%i",4);
                                        fwrite("\n     Got: ",0xb,1,_stdout);
                                        fprintf(_stdout,"%i",(ulong)(uint)fStack_148.trips_count);
                                        fputc(10,_stdout);
                                        greatest_info.fail_line = 0x90;
                                        greatest_info.msg = "4 != counter.trips_count";
                                      }
                                      else {
                                        greatest_info.assertions = greatest_info.assertions + 0xf;
                                        fwrite("\nExpected: ",0xb,1,_stdout);
                                        fprintf(_stdout,"%i",4);
                                        fwrite("\n     Got: ",0xb,1,_stdout);
                                        fprintf(_stdout,"%i",(ulong)(uint)fStack_148.transfers_count
                                               );
                                        fputc(10,_stdout);
                                        greatest_info.fail_line = 0x8f;
                                        greatest_info.msg = "4 != counter.transfers_count";
                                      }
                                    }
                                    else {
                                      greatest_info.assertions = greatest_info.assertions + 0xe;
                                      fwrite("\nExpected: ",0xb,1,_stdout);
                                      fprintf(_stdout,"%i",6);
                                      fwrite("\n     Got: ",0xb,1,_stdout);
                                      fprintf(_stdout,"%i",(ulong)(uint)fStack_148.stops_count);
                                      fputc(10,_stdout);
                                      greatest_info.fail_line = 0x8e;
                                      greatest_info.msg = "6 != counter.stops_count";
                                    }
                                  }
                                  else {
                                    greatest_info.assertions = greatest_info.assertions + 0xd;
                                    fwrite("\nExpected: ",0xb,1,_stdout);
                                    fprintf(_stdout,"%i",0x1c);
                                    fwrite("\n     Got: ",0xb,1,_stdout);
                                    fprintf(_stdout,"%i",(ulong)(uint)fStack_148.stop_times_count);
                                    fputc(10,_stdout);
                                    greatest_info.fail_line = 0x8d;
                                    greatest_info.msg = "28 != counter.stop_times_count";
                                  }
                                }
                                else {
                                  greatest_info.assertions = greatest_info.assertions + 0xc;
                                  fwrite("\nExpected: ",0xb,1,_stdout);
                                  fprintf(_stdout,"%i",10);
                                  fwrite("\n     Got: ",0xb,1,_stdout);
                                  fprintf(_stdout,"%i",(ulong)(uint)fStack_148.shapes_count);
                                  fputc(10,_stdout);
                                  greatest_info.fail_line = 0x8c;
                                  greatest_info.msg = "10 != counter.shapes_count";
                                }
                              }
                              else {
                                greatest_info.assertions = greatest_info.assertions + 0xb;
                                fwrite("\nExpected: ",0xb,1,_stdout);
                                fprintf(_stdout,"%i",8);
                                fwrite("\n     Got: ",0xb,1,_stdout);
                                fprintf(_stdout,"%i",(ulong)(uint)fStack_148.routes_count);
                                fputc(10,_stdout);
                                greatest_info.fail_line = 0x8b;
                                greatest_info.msg = "8 != counter.routes_count";
                              }
                            }
                            else {
                              greatest_info.assertions = greatest_info.assertions + 10;
                              fwrite("\nExpected: ",0xb,1,_stdout);
                              fprintf(_stdout,"%i",2);
                              fwrite("\n     Got: ",0xb,1,_stdout);
                              fprintf(_stdout,"%i",(ulong)(uint)fStack_148.pathways_count);
                              fputc(10,_stdout);
                              greatest_info.fail_line = 0x8a;
                              greatest_info.msg = "2 != counter.pathways_count";
                            }
                          }
                          else {
                            greatest_info.assertions = greatest_info.assertions + 9;
                            fwrite("\nExpected: ",0xb,1,_stdout);
                            fprintf(_stdout,"%i",4);
                            fwrite("\n     Got: ",0xb,1,_stdout);
                            fprintf(_stdout,"%i",(ulong)(uint)fStack_148.levels_count);
                            fputc(10,_stdout);
                            greatest_info.fail_line = 0x89;
                            greatest_info.msg = "4 != counter.levels_count";
                          }
                        }
                        else {
                          greatest_info.assertions = greatest_info.assertions + 8;
                          fwrite("\nExpected: ",0xb,1,_stdout);
                          fprintf(_stdout,"%i",0xb);
                          fwrite("\n     Got: ",0xb,1,_stdout);
                          fprintf(_stdout,"%i",(ulong)(uint)fStack_148.frequencies_count);
                          fputc(10,_stdout);
                          greatest_info.fail_line = 0x88;
                          greatest_info.msg = "11 != counter.frequencies_count";
                        }
                      }
                      else {
                        greatest_info.assertions = greatest_info.assertions + 7;
                        fwrite("\nExpected: ",0xb,1,_stdout);
                        fprintf(_stdout,"%i",1);
                        fwrite("\n     Got: ",0xb,1,_stdout);
                        fprintf(_stdout,"%i",(ulong)(uint)fStack_148.feed_info_count);
                        fputc(10,_stdout);
                        greatest_info.fail_line = 0x87;
                        greatest_info.msg = "1 != counter.feed_info_count";
                      }
                    }
                    else {
                      greatest_info.assertions = greatest_info.assertions + 6;
                      fwrite("\nExpected: ",0xb,1,_stdout);
                      fprintf(_stdout,"%i",4);
                      fwrite("\n     Got: ",0xb,1,_stdout);
                      fprintf(_stdout,"%i",(ulong)(uint)fStack_148.fare_rules_count);
                      fputc(10,_stdout);
                      greatest_info.fail_line = 0x86;
                      greatest_info.msg = "4 != counter.fare_rules_count";
                    }
                  }
                  else {
                    greatest_info.assertions = greatest_info.assertions + 5;
                    fwrite("\nExpected: ",0xb,1,_stdout);
                    fprintf(_stdout,"%i",2);
                    fwrite("\n     Got: ",0xb,1,_stdout);
                    fprintf(_stdout,"%i",(ulong)(uint)fStack_148.fare_attributes_count);
                    fputc(10,_stdout);
                    greatest_info.fail_line = 0x85;
                    greatest_info.msg = "2 != counter.fare_attributes_count";
                  }
                }
                else {
                  greatest_info.assertions = greatest_info.assertions + 4;
                  fwrite("\nExpected: ",0xb,1,_stdout);
                  fprintf(_stdout,"%i",9);
                  fwrite("\n     Got: ",0xb,1,_stdout);
                  fprintf(_stdout,"%i",(ulong)(uint)fStack_148.calendar_dates_count);
                  fputc(10,_stdout);
                  greatest_info.fail_line = 0x84;
                  greatest_info.msg = "9 != counter.calendar_dates_count";
                }
              }
              else {
                greatest_info.assertions = greatest_info.assertions + 3;
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%i",4);
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%i",(ulong)(uint)fStack_148.calendar_records_count);
                fputc(10,_stdout);
                greatest_info.fail_line = 0x83;
                greatest_info.msg = "4 != counter.calendar_records_count";
              }
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 2;
              fwrite("\nExpected: ",0xb,1,_stdout);
              fprintf(_stdout,"%i",4);
              fwrite("\n     Got: ",0xb,1,_stdout);
              fprintf(_stdout,"%i",(ulong)(uint)fStack_148.agency_count);
              fputc(10,_stdout);
              greatest_info.fail_line = 0x82;
              greatest_info.msg = "4 != counter.agency_count";
            }
          }
          else {
            greatest_info.fail_line = 0x81;
            greatest_info.msg = "FEED_DB_SUCCESS != res";
            greatest_info.assertions = greatest_info.assertions + 1;
          }
        }
        else {
          greatest_info.fail_line = 0x7d;
          greatest_info.msg =
               "Failed to create a table layout at `tests_feed_2_counter.db` (writable)";
        }
      }
      else {
        greatest_info.fail_line = 0x79;
        greatest_info.msg = "Failed to initialize a database `tests_feed_2_counter.db` (writable)";
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database.c"
      ;
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_001146e5;
    }
LAB_00113b4e:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_fetch");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    init_feed(&fStack_148);
    fVar2 = init_feed_db(&local_58,"tests_feed_2_counter.db",0);
    if (fVar2 == FEED_DB_SUCCESS) {
      fetch_feed_db(&local_58,&fStack_148);
      if (fStack_148.agency_count == 4) {
        if (fStack_148.calendar_records_count == 4) {
          if (fStack_148.calendar_dates_count == 9) {
            if (fStack_148.fare_attributes_count == 2) {
              if (fStack_148.fare_rules_count == 4) {
                if (fStack_148.feed_info_count == 1) {
                  if (fStack_148.frequencies_count == 0xb) {
                    if (fStack_148.levels_count == 4) {
                      if (fStack_148.pathways_count == 2) {
                        if (fStack_148.routes_count == 8) {
                          if (fStack_148.shapes_count == 10) {
                            if (fStack_148.stop_times_count == 0x1c) {
                              if (fStack_148.stops_count == 6) {
                                if (fStack_148.transfers_count == 4) {
                                  greatest_info.assertions = greatest_info.assertions + 0xf;
                                  if (fStack_148.trips_count == 4) {
                                    free_feed_db(&local_58);
                                    free_feed(&fStack_148);
                                    greatest_info.msg = (char *)0x0;
                                    iVar1 = 0;
                                    goto LAB_001146ce;
                                  }
                                  fwrite("\nExpected: ",0xb,1,_stdout);
                                  fprintf(_stdout,"%i",4);
                                  fwrite("\n     Got: ",0xb,1,_stdout);
                                  fprintf(_stdout,"%i",(ulong)(uint)fStack_148.trips_count);
                                  fputc(10,_stdout);
                                  greatest_info.fail_line = 0xb2;
                                  greatest_info.msg = "4 != feed.trips_count";
                                }
                                else {
                                  greatest_info.assertions = greatest_info.assertions + 0xe;
                                  fwrite("\nExpected: ",0xb,1,_stdout);
                                  fprintf(_stdout,"%i",4);
                                  fwrite("\n     Got: ",0xb,1,_stdout);
                                  fprintf(_stdout,"%i",(ulong)(uint)fStack_148.transfers_count);
                                  fputc(10,_stdout);
                                  greatest_info.fail_line = 0xb1;
                                  greatest_info.msg = "4 != feed.transfers_count";
                                }
                              }
                              else {
                                greatest_info.assertions = greatest_info.assertions + 0xd;
                                fwrite("\nExpected: ",0xb,1,_stdout);
                                fprintf(_stdout,"%i",6);
                                fwrite("\n     Got: ",0xb,1,_stdout);
                                fprintf(_stdout,"%i",(ulong)(uint)fStack_148.stops_count);
                                fputc(10,_stdout);
                                greatest_info.fail_line = 0xb0;
                                greatest_info.msg = "6 != feed.stops_count";
                              }
                            }
                            else {
                              greatest_info.assertions = greatest_info.assertions + 0xc;
                              fwrite("\nExpected: ",0xb,1,_stdout);
                              fprintf(_stdout,"%i",0x1c);
                              fwrite("\n     Got: ",0xb,1,_stdout);
                              fprintf(_stdout,"%i",(ulong)(uint)fStack_148.stop_times_count);
                              fputc(10,_stdout);
                              greatest_info.fail_line = 0xaf;
                              greatest_info.msg = "28 != feed.stop_times_count";
                            }
                          }
                          else {
                            greatest_info.assertions = greatest_info.assertions + 0xb;
                            fwrite("\nExpected: ",0xb,1,_stdout);
                            fprintf(_stdout,"%i",10);
                            fwrite("\n     Got: ",0xb,1,_stdout);
                            fprintf(_stdout,"%i",(ulong)(uint)fStack_148.shapes_count);
                            fputc(10,_stdout);
                            greatest_info.fail_line = 0xae;
                            greatest_info.msg = "10 != feed.shapes_count";
                          }
                        }
                        else {
                          greatest_info.assertions = greatest_info.assertions + 10;
                          fwrite("\nExpected: ",0xb,1,_stdout);
                          fprintf(_stdout,"%i",8);
                          fwrite("\n     Got: ",0xb,1,_stdout);
                          fprintf(_stdout,"%i",(ulong)(uint)fStack_148.routes_count);
                          fputc(10,_stdout);
                          greatest_info.fail_line = 0xad;
                          greatest_info.msg = "8 != feed.routes_count";
                        }
                      }
                      else {
                        greatest_info.assertions = greatest_info.assertions + 9;
                        fwrite("\nExpected: ",0xb,1,_stdout);
                        fprintf(_stdout,"%i",2);
                        fwrite("\n     Got: ",0xb,1,_stdout);
                        fprintf(_stdout,"%i",(ulong)(uint)fStack_148.pathways_count);
                        fputc(10,_stdout);
                        greatest_info.fail_line = 0xac;
                        greatest_info.msg = "2 != feed.pathways_count";
                      }
                    }
                    else {
                      greatest_info.assertions = greatest_info.assertions + 8;
                      fwrite("\nExpected: ",0xb,1,_stdout);
                      fprintf(_stdout,"%i",4);
                      fwrite("\n     Got: ",0xb,1,_stdout);
                      fprintf(_stdout,"%i",(ulong)(uint)fStack_148.levels_count);
                      fputc(10,_stdout);
                      greatest_info.fail_line = 0xab;
                      greatest_info.msg = "4 != feed.levels_count";
                    }
                  }
                  else {
                    greatest_info.assertions = greatest_info.assertions + 7;
                    fwrite("\nExpected: ",0xb,1,_stdout);
                    fprintf(_stdout,"%i",0xb);
                    fwrite("\n     Got: ",0xb,1,_stdout);
                    fprintf(_stdout,"%i",(ulong)(uint)fStack_148.frequencies_count);
                    fputc(10,_stdout);
                    greatest_info.fail_line = 0xaa;
                    greatest_info.msg = "11 != feed.frequencies_count";
                  }
                }
                else {
                  greatest_info.assertions = greatest_info.assertions + 6;
                  fwrite("\nExpected: ",0xb,1,_stdout);
                  fprintf(_stdout,"%i",1);
                  fwrite("\n     Got: ",0xb,1,_stdout);
                  fprintf(_stdout,"%i",(ulong)(uint)fStack_148.feed_info_count);
                  fputc(10,_stdout);
                  greatest_info.fail_line = 0xa9;
                  greatest_info.msg = "1 != feed.feed_info_count";
                }
              }
              else {
                greatest_info.assertions = greatest_info.assertions + 5;
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%i",4);
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%i",(ulong)(uint)fStack_148.fare_rules_count);
                fputc(10,_stdout);
                greatest_info.fail_line = 0xa8;
                greatest_info.msg = "4 != feed.fare_rules_count";
              }
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 4;
              fwrite("\nExpected: ",0xb,1,_stdout);
              fprintf(_stdout,"%i",2);
              fwrite("\n     Got: ",0xb,1,_stdout);
              fprintf(_stdout,"%i",(ulong)(uint)fStack_148.fare_attributes_count);
              fputc(10,_stdout);
              greatest_info.fail_line = 0xa7;
              greatest_info.msg = "2 != feed.fare_attributes_count";
            }
          }
          else {
            greatest_info.assertions = greatest_info.assertions + 3;
            fwrite("\nExpected: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",9);
            fwrite("\n     Got: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",(ulong)(uint)fStack_148.calendar_dates_count);
            fputc(10,_stdout);
            greatest_info.fail_line = 0xa6;
            greatest_info.msg = "9 != feed.calendar_dates_count";
          }
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 2;
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",4);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)(uint)fStack_148.calendar_records_count);
          fputc(10,_stdout);
          greatest_info.fail_line = 0xa5;
          greatest_info.msg = "4 != feed.calendar_records_count";
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",4);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)(uint)fStack_148.agency_count);
        fputc(10,_stdout);
        greatest_info.fail_line = 0xa4;
        greatest_info.msg = "4 != feed.agency_count";
      }
    }
    else {
      greatest_info.fail_line = 0xa0;
      greatest_info.msg = "Failed to initialize a database `tests_feed_2_counter.db` (non-writable)"
      ;
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database.c"
    ;
    iVar1 = -1;
    if ((greatest_info.flags & 4) != 0) {
LAB_001146e5:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database.c"
      ;
      abort();
    }
  }
LAB_001146ce:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_Database) {
    RUN_TEST(db_init_close_writable);
    RUN_TEST(db_init_close_readable_error);
    RUN_TEST(db_init_close_readable_success);
    RUN_TEST(db_import);
    RUN_TEST(db_store_no_counter);
    RUN_TEST(db_store_partial);
    RUN_TEST(db_store_counter); // These two tests must come together AND in this order
    RUN_TEST(db_fetch);         // as db_fetch() uses the db file created by db_store_counter.
}